

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

mi_heap_t * mi_heap_set_default(mi_heap_t *heap)

{
  _Bool _Var1;
  mi_heap_t *pmVar2;
  mi_heap_t *in_RDI;
  mi_heap_t *old;
  
  if ((in_RDI != (mi_heap_t *)0x0) && (_Var1 = mi_heap_is_initialized(in_RDI), _Var1)) {
    pmVar2 = mi_prim_get_default_heap();
    _mi_heap_set_default_direct((mi_heap_t *)0xa8530d);
    return pmVar2;
  }
  return (mi_heap_t *)0x0;
}

Assistant:

mi_heap_t* mi_heap_set_default(mi_heap_t* heap) {
  mi_assert(heap != NULL);
  mi_assert(mi_heap_is_initialized(heap));
  if (heap==NULL || !mi_heap_is_initialized(heap)) return NULL;
  mi_assert_expensive(mi_heap_is_valid(heap));
  mi_heap_t* old = mi_prim_get_default_heap();
  _mi_heap_set_default_direct(heap);
  return old;
}